

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O1

int archive_write_zip_finish_entry(archive_write *a)

{
  compression cVar1;
  zip_conflict *zip;
  long lVar2;
  int64_t iVar3;
  uchar *puVar4;
  bool bVar5;
  bool bVar6;
  undefined1 uVar7;
  int iVar8;
  int iVar9;
  wchar_t wVar10;
  time_t tVar11;
  uchar *puVar12;
  long lVar13;
  uchar *p;
  undefined1 *puVar14;
  int unaff_EBP;
  int iVar15;
  char *in_len;
  size_t sVar16;
  uchar *p_1;
  int64_t *piVar17;
  size_t outl;
  size_t hmac_len;
  undefined1 local_58 [4];
  undefined8 uStack_54;
  undefined1 local_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  undefined1 uStack_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 local_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 auStack_41 [9];
  size_t local_38;
  
  zip = (zip_conflict *)a->format_data;
  cVar1 = zip->entry_compression;
  if (cVar1 < COMPRESSION_ZSTD) {
    if (cVar1 == COMPRESSION_DEFLATE) {
      iVar9 = unaff_EBP;
      do {
        iVar8 = deflate(&zip->stream,4);
        iVar15 = 1;
        if (iVar8 == -2) {
          iVar15 = 1;
          unaff_EBP = -0x1e;
        }
        else {
          sVar16 = zip->len_buf - (ulong)(zip->stream).lzma.options.lp;
          if (zip->tctx_valid == '\0') {
            if (zip->cctx_valid != '\0') {
              local_58._0_2_ = (undefined2)sVar16;
              local_58._2_2_ = (undefined2)(sVar16 >> 0x10);
              uStack_54._0_4_ = (uint32_t)(sVar16 >> 0x20);
              iVar8 = aes_ctr_update(&zip->cctx,zip->buf,sVar16,zip->buf,(size_t *)local_58);
              if (iVar8 < 0) {
                archive_set_error(&a->archive,-1,"Failed to encrypt file");
                unaff_EBP = -0x19;
                goto LAB_0028758d;
              }
              __hmac_sha1_update(&zip->hctx,zip->buf,sVar16);
            }
          }
          else {
            trad_enc_encrypt_update(&zip->tctx,zip->buf,sVar16,zip->buf,sVar16);
          }
          unaff_EBP = __archive_write_output(a,zip->buf,sVar16);
          iVar15 = 1;
          if (unaff_EBP == 0) {
            zip->entry_compressed_written = zip->entry_compressed_written + sVar16;
            zip->written_bytes = zip->written_bytes + sVar16;
            (zip->stream).deflate.next_out = zip->buf;
            iVar15 = 3;
            unaff_EBP = iVar9;
            if ((zip->stream).lzma.options.lp == 0) {
              (zip->stream).lzma.options.lp = (uint32_t)zip->len_buf;
              iVar15 = 0;
            }
          }
        }
LAB_0028758d:
        iVar9 = unaff_EBP;
      } while (iVar15 == 0);
      if (iVar15 != 3) {
        return unaff_EBP;
      }
      deflateEnd(&zip->stream);
      goto LAB_002875aa;
    }
    if (cVar1 != COMPRESSION_LZMA) goto LAB_002875aa;
  }
  else if (cVar1 != COMPRESSION_XZ) {
    if (cVar1 == COMPRESSION_ZSTD) {
      do {
        lVar13 = ZSTD_endStream((zip->stream).deflate.next_in,
                                (undefined1 *)((long)&zip->stream + 0x20));
        if (lVar13 == 0) {
          bVar6 = false;
LAB_0028716e:
          in_len = (zip->stream).deflate.msg + (zip->len_buf - (zip->stream).deflate.total_out);
          if (zip->tctx_valid == '\0') {
            if (zip->cctx_valid != '\0') {
              local_58._0_2_ = SUB82(in_len,0);
              local_58._2_2_ = (undefined2)((ulong)in_len >> 0x10);
              uStack_54._0_4_ = (uint32_t)((ulong)in_len >> 0x20);
              iVar9 = aes_ctr_update(&zip->cctx,zip->buf,(size_t)in_len,zip->buf,(size_t *)local_58)
              ;
              if (iVar9 < 0) {
                archive_set_error(&a->archive,-1,"Failed to encrypt file");
                unaff_EBP = -0x19;
                bVar5 = false;
                goto LAB_0028727d;
              }
              __hmac_sha1_update(&zip->hctx,zip->buf,(size_t)in_len);
            }
          }
          else {
            trad_enc_encrypt_update(&zip->tctx,zip->buf,(size_t)in_len,zip->buf,(size_t)in_len);
          }
          iVar9 = __archive_write_output(a,zip->buf,(size_t)in_len);
          if (iVar9 == 0) {
            zip->entry_compressed_written = (int64_t)(in_len + zip->entry_compressed_written);
            zip->written_bytes = (int64_t)(in_len + zip->written_bytes);
            (zip->stream).zstd.out.dst = zip->buf;
            if ((zip->stream).deflate.msg != (char *)(zip->stream).deflate.total_out) {
              bVar6 = false;
            }
            (zip->stream).deflate.total_out = zip->len_buf;
            bVar5 = true;
          }
          else {
            bVar5 = false;
            unaff_EBP = iVar9;
          }
        }
        else {
          iVar9 = ZSTD_isError(lVar13);
          bVar6 = true;
          if (iVar9 == 0) goto LAB_0028716e;
          bVar5 = false;
          unaff_EBP = -0x1e;
        }
LAB_0028727d:
        if (!bVar5) {
          return unaff_EBP;
        }
      } while (bVar6);
      ZSTD_freeCStream((zip->stream).deflate.next_in);
    }
    goto LAB_002875aa;
  }
  puVar14 = (undefined1 *)((long)&zip->stream + 0x78);
  do {
    iVar9 = lzma_code(puVar14,3);
    bVar6 = false;
    if (iVar9 == 1) {
      bVar5 = false;
LAB_00287312:
      sVar16 = zip->len_buf - (zip->stream).lzma.context.avail_out;
      if (zip->tctx_valid == '\0') {
        if (zip->cctx_valid != '\0') {
          local_58._0_2_ = (undefined2)sVar16;
          local_58._2_2_ = (undefined2)(sVar16 >> 0x10);
          uStack_54._0_4_ = (uint32_t)(sVar16 >> 0x20);
          iVar9 = aes_ctr_update(&zip->cctx,zip->buf,sVar16,zip->buf,(size_t *)local_58);
          if (iVar9 < 0) {
            archive_set_error(&a->archive,-1,"Failed to encrypt file");
            unaff_EBP = -0x19;
            bVar6 = false;
            goto LAB_00287413;
          }
          __hmac_sha1_update(&zip->hctx,zip->buf,sVar16);
        }
      }
      else {
        trad_enc_encrypt_update(&zip->tctx,zip->buf,sVar16,zip->buf,sVar16);
      }
      iVar9 = __archive_write_output(a,zip->buf,sVar16);
      if (iVar9 == 0) {
        zip->entry_compressed_written = zip->entry_compressed_written + sVar16;
        zip->written_bytes = zip->written_bytes + sVar16;
        (zip->stream).lzma.context.next_out = zip->buf;
        if ((zip->stream).lzma.context.avail_out != 0) {
          bVar5 = false;
        }
        *(ulong *)((long)&zip->stream + 0x98) = (ulong)(uint)zip->len_buf;
        bVar6 = true;
      }
      else {
        bVar6 = false;
        unaff_EBP = iVar9;
      }
    }
    else {
      if (iVar9 != 5) {
        bVar5 = true;
        goto LAB_00287312;
      }
      bVar5 = true;
      unaff_EBP = -0x1e;
    }
LAB_00287413:
    if (!bVar6) {
      return unaff_EBP;
    }
  } while (bVar5);
  lzma_end(puVar14);
LAB_002875aa:
  if (zip->hctx_valid != '\0') {
    local_38 = 0x14;
    __hmac_sha1_final(&zip->hctx,local_58,&local_38);
    iVar9 = __archive_write_output(a,local_58,10);
    if (iVar9 != 0) {
      return iVar9;
    }
    zip->entry_compressed_written = zip->entry_compressed_written + 10;
    zip->written_bytes = zip->written_bytes + 10;
  }
  if ((zip->entry_flags & 8) != 0) {
    local_58._0_2_ = 0x4b50;
    local_58._2_2_ = 0x807;
    if ((zip->cctx_valid == '\0') || (zip->aes_vendor != 2)) {
      uStack_54._0_4_ = zip->entry_crc32;
    }
    else {
      uStack_54._0_4_ = 0;
    }
    lVar13 = zip->entry_compressed_written;
    uStack_54._4_1_ = (undefined1)lVar13;
    uStack_54._5_1_ = (undefined1)((ulong)lVar13 >> 8);
    uStack_54._6_1_ = (undefined1)((ulong)lVar13 >> 0x10);
    uStack_54._7_1_ = (undefined1)((ulong)lVar13 >> 0x18);
    if (((lVar13 < 0x100000000) && (lVar2 = zip->entry_uncompressed_written, lVar2 < 0x100000000))
       && ((zip->flags & 2) == 0)) {
      puVar14 = &uStack_49;
      local_4c = (undefined1)lVar2;
      uStack_4b = (undefined1)((ulong)lVar2 >> 8);
      uStack_4a = (undefined1)((ulong)lVar2 >> 0x10);
      uVar7 = (undefined1)((ulong)lVar2 >> 0x18);
      sVar16 = 0x10;
    }
    else {
      puVar14 = auStack_41;
      local_4c = (undefined1)((ulong)lVar13 >> 0x20);
      uStack_4b = (undefined1)((ulong)lVar13 >> 0x28);
      uStack_4a = (undefined1)((ulong)lVar13 >> 0x30);
      uStack_49 = (undefined1)((ulong)lVar13 >> 0x38);
      iVar3 = zip->entry_uncompressed_written;
      uStack_48 = (undefined1)iVar3;
      uStack_47 = (undefined1)((ulong)iVar3 >> 8);
      uStack_46 = (undefined1)((ulong)iVar3 >> 0x10);
      uStack_45 = (undefined1)((ulong)iVar3 >> 0x18);
      local_44 = (undefined1)((ulong)iVar3 >> 0x20);
      uStack_43 = (undefined1)((ulong)iVar3 >> 0x28);
      uStack_42 = (undefined1)((ulong)iVar3 >> 0x30);
      uVar7 = (undefined1)((ulong)iVar3 >> 0x38);
      sVar16 = 0x18;
    }
    *puVar14 = uVar7;
    iVar9 = __archive_write_output(a,local_58,sVar16);
    zip->written_bytes = zip->written_bytes + sVar16;
    if (iVar9 != 0) {
      return -0x1e;
    }
  }
  wVar10 = archive_entry_mtime_is_set(zip->entry);
  if (wVar10 != L'\0') {
    tVar11 = archive_entry_mtime(zip->entry);
    puVar12 = cd_alloc(zip,9);
    if (puVar12 == (uchar *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate zip data");
      return -0x1e;
    }
    puVar12[4] = '\x01';
    puVar12[0] = 'U';
    puVar12[1] = 'T';
    puVar12[2] = '\x05';
    puVar12[3] = '\0';
    *(int *)(puVar12 + 5) = (int)tVar11;
  }
  if ((zip->cctx_valid == '\0') || (zip->aes_vendor != 2)) {
    *(uint32_t *)(zip->file_header + 0x10) = zip->entry_crc32;
  }
  else {
    puVar12 = zip->file_header;
    puVar12[0x10] = '\0';
    puVar12[0x11] = '\0';
    puVar12[0x12] = '\0';
    puVar12[0x13] = '\0';
  }
  *(int *)(zip->file_header + 0x14) = (int)zip->entry_compressed_written;
  *(int *)(zip->file_header + 0x18) = (int)zip->entry_uncompressed_written;
  *(short *)(zip->file_header + 0x1e) =
       (short)(int)zip->central_directory_bytes - (short)(int)zip->file_header_extra_offset;
  *(int *)(zip->file_header + 0x2a) = (int)zip->entry_offset;
  if (((0xfffffffe < zip->entry_compressed_written) ||
      (0xfffffffe < zip->entry_uncompressed_written)) || (0xffffffff < zip->entry_offset)) {
    local_58._0_2_ = 1;
    piVar17 = &uStack_54;
    if (0xfffffffe < zip->entry_uncompressed_written) {
      puVar12 = zip->file_header;
      puVar12[0x18] = 0xff;
      puVar12[0x19] = 0xff;
      puVar12[0x1a] = 0xff;
      puVar12[0x1b] = 0xff;
      iVar3 = zip->entry_uncompressed_written;
      piVar17 = (int64_t *)&local_4c;
      uStack_54._0_4_ = (uint32_t)iVar3;
      uStack_54._4_1_ = (undefined1)((ulong)iVar3 >> 0x20);
      uStack_54._5_1_ = (undefined1)((ulong)iVar3 >> 0x28);
      uStack_54._6_1_ = (undefined1)((ulong)iVar3 >> 0x30);
      uStack_54._7_1_ = (undefined1)((ulong)iVar3 >> 0x38);
    }
    if (0xfffffffe < zip->entry_compressed_written) {
      puVar12 = zip->file_header;
      puVar12[0x14] = 0xff;
      puVar12[0x15] = 0xff;
      puVar12[0x16] = 0xff;
      puVar12[0x17] = 0xff;
      *piVar17 = zip->entry_compressed_written;
      piVar17 = piVar17 + 1;
    }
    if (0xfffffffe < zip->entry_offset) {
      puVar12 = zip->file_header;
      puVar12[0x2a] = 0xff;
      puVar12[0x2b] = 0xff;
      puVar12[0x2c] = 0xff;
      puVar12[0x2d] = 0xff;
      *piVar17 = zip->entry_offset;
      piVar17 = piVar17 + 1;
    }
    local_58._2_2_ = (short)piVar17 - (short)&uStack_54;
    puVar12 = cd_alloc(zip,(long)piVar17 - (long)local_58);
    if (puVar12 == (uchar *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate zip data");
      unaff_EBP = -0x1e;
    }
    else {
      memcpy(puVar12,local_58,(long)piVar17 - (long)local_58);
      puVar4 = zip->file_header;
      if (*(ushort *)(puVar4 + 6) < 0x2d) {
        puVar4[6] = '-';
        puVar4[7] = '\0';
      }
    }
    if (puVar12 == (uchar *)0x0) {
      return unaff_EBP;
    }
  }
  if ((zip->cctx_valid == '\0') || (zip->aes_vendor != 2)) {
    *(uint32_t *)(zip->file_header + 0x10) = zip->entry_crc32;
  }
  else {
    puVar12 = zip->file_header;
    puVar12[0x10] = '\0';
    puVar12[0x11] = '\0';
    puVar12[0x12] = '\0';
    puVar12[0x13] = '\0';
  }
  lVar13 = zip->entry_compressed_written;
  if (0xfffffffe < lVar13) {
    lVar13 = 0xffffffff;
  }
  *(int *)(zip->file_header + 0x14) = (int)lVar13;
  lVar13 = zip->entry_uncompressed_written;
  if (0xfffffffe < lVar13) {
    lVar13 = 0xffffffff;
  }
  *(int *)(zip->file_header + 0x18) = (int)lVar13;
  *(short *)(zip->file_header + 0x1e) =
       (short)(int)zip->central_directory_bytes - (short)(int)zip->file_header_extra_offset;
  lVar13 = 0xffffffff;
  if (zip->entry_offset < 0xffffffff) {
    lVar13 = zip->entry_offset;
  }
  *(int *)(zip->file_header + 0x2a) = (int)lVar13;
  return 0;
}

Assistant:

static int
archive_write_zip_finish_entry(struct archive_write *a)
{
	struct zip *zip = a->format_data;
	int ret;
#if defined(HAVE_BZLIB_H) || (defined(HAVE_ZSTD_H) && HAVE_ZSTD_compressStream) || HAVE_LZMA_H
	char finishing;
#endif

	switch (zip->entry_compression) {
#ifdef HAVE_ZLIB_H
	case COMPRESSION_DEFLATE:
		for (;;) {
			size_t remainder;

			ret = deflate(&zip->stream.deflate, Z_FINISH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.deflate.avail_out;
			if (zip->tctx_valid) {
				trad_enc_encrypt_update(&zip->tctx,
				    zip->buf, remainder, zip->buf, remainder);
			} else if (zip->cctx_valid) {
				size_t outl = remainder;
				ret = archive_encrypto_aes_ctr_update(
				    &zip->cctx, zip->buf, remainder,
				    zip->buf, &outl);
				if (ret < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to encrypt file");
					return (ARCHIVE_FAILED);
				}
				archive_hmac_sha1_update(&zip->hctx,
				    zip->buf, remainder);
			}
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.deflate.next_out = zip->buf;
			if (zip->stream.deflate.avail_out != 0)
				break;
			zip->stream.deflate.avail_out = (uInt)zip->len_buf;
		}
		deflateEnd(&zip->stream.deflate);
		break;
#endif
#ifdef HAVE_BZLIB_H
	case COMPRESSION_BZIP2:
		finishing = 1;
		do {
			size_t remainder;

			ret = BZ2_bzCompress(&zip->stream.bzip2, BZ_FINISH);
			if (ret == BZ_STREAM_END)
				finishing = 0;
			else if (ret != BZ_RUN_OK && ret != BZ_FINISH_OK)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.bzip2.avail_out;
			if (zip->tctx_valid) {
				trad_enc_encrypt_update(&zip->tctx,
				    zip->buf, remainder, zip->buf, remainder);
			} else if (zip->cctx_valid) {
				size_t outl = remainder;
				ret = archive_encrypto_aes_ctr_update(
				    &zip->cctx, zip->buf, remainder,
				    zip->buf, &outl);
				if (ret < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to encrypt file");
					return (ARCHIVE_FAILED);
				}
				archive_hmac_sha1_update(&zip->hctx,
				    zip->buf, remainder);
			}
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.bzip2.next_out = (char*)zip->buf;
			if (zip->stream.bzip2.avail_out != 0)
				finishing = 0;
			zip->stream.bzip2.avail_out = (unsigned int)zip->len_buf;
		} while (finishing);
		BZ2_bzCompressEnd(&zip->stream.bzip2);
		break;
#endif
#if defined(HAVE_ZSTD_H) && HAVE_ZSTD_compressStream
	case COMPRESSION_ZSTD:
		finishing = 1;
		do {
			size_t remainder;

			size_t zret = ZSTD_endStream(zip->stream.zstd.context, &zip->stream.zstd.out);
			if (zret == 0)
				finishing = 0;
			else if (ZSTD_isError(zret))
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - (zip->stream.zstd.out.size - zip->stream.zstd.out.pos);
			if (zip->tctx_valid) {
				trad_enc_encrypt_update(&zip->tctx,
				    zip->buf, remainder, zip->buf, remainder);
			} else if (zip->cctx_valid) {
				size_t outl = remainder;
				ret = archive_encrypto_aes_ctr_update(
				    &zip->cctx, zip->buf, remainder,
				    zip->buf, &outl);
				if (ret < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to encrypt file");
					return (ARCHIVE_FAILED);
				}
				archive_hmac_sha1_update(&zip->hctx,
				    zip->buf, remainder);
			}
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.zstd.out.dst = zip->buf;
			if (zip->stream.zstd.out.pos != zip->stream.zstd.out.size)
				finishing = 0;
			zip->stream.zstd.out.size = zip->len_buf;
		} while (finishing);
		ZSTD_freeCStream(zip->stream.zstd.context);
		break;
#endif
#ifdef HAVE_LZMA_H
	/* XZ and LZMA share clean-up code */
	case COMPRESSION_LZMA:
	case COMPRESSION_XZ:
		finishing = 1;
		do {
			size_t remainder;

			ret = lzma_code(&zip->stream.lzma.context, LZMA_FINISH);
			if (ret == LZMA_STREAM_END)
				finishing = 0;
			else if (ret == LZMA_MEM_ERROR)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.lzma.context.avail_out;
			if (zip->tctx_valid) {
				trad_enc_encrypt_update(&zip->tctx,
				    zip->buf, remainder, zip->buf, remainder);
			} else if (zip->cctx_valid) {
				size_t outl = remainder;
				ret = archive_encrypto_aes_ctr_update(
				    &zip->cctx, zip->buf, remainder,
				    zip->buf, &outl);
				if (ret < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to encrypt file");
					return (ARCHIVE_FAILED);
				}
				archive_hmac_sha1_update(&zip->hctx,
				    zip->buf, remainder);
			}
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.lzma.context.next_out = zip->buf;
			if (zip->stream.lzma.context.avail_out != 0)
				finishing = 0;
			zip->stream.lzma.context.avail_out = (unsigned int)zip->len_buf;
		} while (finishing);
		lzma_end(&zip->stream.lzma.context);
		break;
#endif
	default:
		break;
	}
	if (zip->hctx_valid) {
		uint8_t hmac[20];
		size_t hmac_len = 20;

		archive_hmac_sha1_final(&zip->hctx, hmac, &hmac_len);
		ret = __archive_write_output(a, hmac, AUTH_CODE_SIZE);
		if (ret != ARCHIVE_OK)
			return (ret);
		zip->entry_compressed_written += AUTH_CODE_SIZE;
		zip->written_bytes += AUTH_CODE_SIZE;
	}

	/* Write trailing data descriptor. */
	if ((zip->entry_flags & ZIP_ENTRY_FLAG_LENGTH_AT_END) != 0) {
		char d[24];
		memcpy(d, "PK\007\010", 4);
		if (zip->cctx_valid && zip->aes_vendor == AES_VENDOR_AE_2)
			archive_le32enc(d + 4, 0);/* no CRC.*/
		else
			archive_le32enc(d + 4, zip->entry_crc32);
		if (zip->entry_compressed_written > ZIP_4GB_MAX
		    || zip->entry_uncompressed_written > ZIP_4GB_MAX
		    || zip->flags & ZIP_FLAG_FORCE_ZIP64) {
			archive_le64enc(d + 8,
				(uint64_t)zip->entry_compressed_written);
			archive_le64enc(d + 16,
				(uint64_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 24);
			zip->written_bytes += 24;
		} else {
			archive_le32enc(d + 8,
				(uint32_t)zip->entry_compressed_written);
			archive_le32enc(d + 12,
				(uint32_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 16);
			zip->written_bytes += 16;
		}
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/* UT timestamp: Info-Zip specifies that _only_ the mtime should
	 * be recorded here; ctime and atime are also included in the
	 * local file descriptor. */
	if (archive_entry_mtime_is_set(zip->entry)) {
		unsigned char ut[9];
		unsigned char *u = ut, *ud;
		memcpy(u, "UT\005\000\001", 5);
		u += 5;
		archive_le32enc(u, (uint32_t)archive_entry_mtime(zip->entry));
		u += 4;
		ud = cd_alloc(zip, u - ut);
		if (ud == NULL) {
			archive_set_error(&a->archive, ENOMEM,
					  "Can't allocate zip data");
			return (ARCHIVE_FATAL);
		}
		memcpy(ud, ut, u - ut);
	}

	/* Fill in size information in the central directory entry. */
	/* Fix up central directory file header. */
	if (zip->cctx_valid && zip->aes_vendor == AES_VENDOR_AE_2)
		archive_le32enc(zip->file_header + 16, 0);/* no CRC.*/
	else
		archive_le32enc(zip->file_header + 16, zip->entry_crc32);
	/* Truncate to 32 bits; we'll fix up below. */
	archive_le32enc(zip->file_header + 20, (uint32_t)zip->entry_compressed_written);
	archive_le32enc(zip->file_header + 24, (uint32_t)zip->entry_uncompressed_written);
	archive_le16enc(zip->file_header + 30,
	    (uint16_t)(zip->central_directory_bytes - zip->file_header_extra_offset));
	archive_le32enc(zip->file_header + 42, (uint32_t)zip->entry_offset);

	/* If any of the values immediately above are too large, we'll
	 * need to put the corresponding value in a Zip64 extra field
	 * and set the central directory value to 0xffffffff as a flag. */
	if (zip->entry_compressed_written >= ZIP_4GB_MAX
	    || zip->entry_uncompressed_written >= ZIP_4GB_MAX
	    || zip->entry_offset > ZIP_4GB_MAX) {
		unsigned char zip64[32];
		unsigned char *z = zip64, *zd;
		memcpy(z, "\001\000\000\000", 4);
		z += 4;
		if (zip->entry_uncompressed_written >= ZIP_4GB_MAX) {
			archive_le32enc(zip->file_header + 24, ZIP_4GB_MAX);
			archive_le64enc(z, zip->entry_uncompressed_written);
			z += 8;
		}
		if (zip->entry_compressed_written >= ZIP_4GB_MAX) {
			archive_le32enc(zip->file_header + 20, ZIP_4GB_MAX);
			archive_le64enc(z, zip->entry_compressed_written);
			z += 8;
		}
		if (zip->entry_offset >= ZIP_4GB_MAX) {
			archive_le32enc(zip->file_header + 42, ZIP_4GB_MAX);
			archive_le64enc(z, zip->entry_offset);
			z += 8;
		}
		archive_le16enc(zip64 + 2, (uint16_t)(z - (zip64 + 4)));
		zd = cd_alloc(zip, z - zip64);
		if (zd == NULL) {
			archive_set_error(&a->archive, ENOMEM,
				"Can't allocate zip data");
			return (ARCHIVE_FATAL);
		}
		memcpy(zd, zip64, z - zip64);
		/* Zip64 means version needs to be set to at least 4.5 */
		if (archive_le16dec(zip->file_header + 6) < 45)
			archive_le16enc(zip->file_header + 6, 45);
	}

	/* Fix up central directory file header. */
	if (zip->cctx_valid && zip->aes_vendor == AES_VENDOR_AE_2)
		archive_le32enc(zip->file_header + 16, 0);/* no CRC.*/
	else
		archive_le32enc(zip->file_header + 16, zip->entry_crc32);
	archive_le32enc(zip->file_header + 20,
		(uint32_t)zipmin(zip->entry_compressed_written,
				 ZIP_4GB_MAX));
	archive_le32enc(zip->file_header + 24,
		(uint32_t)zipmin(zip->entry_uncompressed_written,
				 ZIP_4GB_MAX));
	archive_le16enc(zip->file_header + 30,
	    (uint16_t)(zip->central_directory_bytes - zip->file_header_extra_offset));
	archive_le32enc(zip->file_header + 42,
		(uint32_t)zipmin(zip->entry_offset,
				 ZIP_4GB_MAX));

	return (ARCHIVE_OK);
}